

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::rowsInserted(QFileDialogPrivate *this,QModelIndex *parent)

{
  QFileDialogTreeView *this_00;
  bool bVar1;
  char cVar2;
  QItemSelectionModel *pQVar3;
  QAbstractItemModel *pQVar4;
  long in_FS_OFFSET;
  QModelIndex QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = ((this->qFileDialogUi).d)->treeView;
  if (this_00 != (QFileDialogTreeView *)0x0) {
    QAbstractItemView::rootIndex(&QStack_38,(QAbstractItemView *)this_00);
    bVar1 = ::operator!=(parent,&QStack_38);
    if (!bVar1) {
      pQVar3 = QAbstractItemView::selectionModel
                         ((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
      if (pQVar3 != (QItemSelectionModel *)0x0) {
        QAbstractItemView::selectionModel((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
        cVar2 = QItemSelectionModel::hasSelection();
        if (cVar2 == '\0') {
          pQVar4 = QAbstractItemView::model
                             ((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
          (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,parent);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::rowsInserted(const QModelIndex &parent)
{
    if (!qFileDialogUi->treeView
        || parent != qFileDialogUi->treeView->rootIndex()
        || !qFileDialogUi->treeView->selectionModel()
        || qFileDialogUi->treeView->selectionModel()->hasSelection()
        || qFileDialogUi->treeView->model()->rowCount(parent) == 0)
        return;
}